

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZGeoElSide,_10>::Resize
          (TPZManVector<TPZGeoElSide,_10> *this,int64_t newsize,TPZGeoElSide *object)

{
  long lVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  TPZGeoElSide *pTVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  TPZGeoElSide *pTVar7;
  long in_RSI;
  TPZManVector<TPZGeoElSide,_10> *in_RDI;
  ulong uVar8;
  TPZGeoElSide *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  TPZGeoElSide *in_stack_ffffffffffffff38;
  TPZGeoElSide *in_stack_ffffffffffffff40;
  TPZGeoElSide *pTVar9;
  TPZGeoElSide *local_88;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZGeoElSide>).fNElements) {
    if ((in_RDI->super_TPZVec<TPZGeoElSide>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        for (local_28 = 0; local_28 < (in_RDI->super_TPZVec<TPZGeoElSide>).fNElements;
            local_28 = local_28 + 1) {
          TPZGeoElSide::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          TPZGeoElSide::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
        if (((in_RDI->super_TPZVec<TPZGeoElSide>).fStore != (TPZGeoElSide *)&in_RDI->field_0x20) &&
           (pTVar7 = (in_RDI->super_TPZVec<TPZGeoElSide>).fStore, pTVar7 != (TPZGeoElSide *)0x0)) {
          lVar1 = *(long *)&pTVar7[-1].fSide;
          for (pTVar3 = pTVar7 + lVar1; pTVar7 != pTVar3; pTVar3 = pTVar3 + -1) {
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x11047cc);
          }
          operator_delete__(&pTVar7[-1].fSide,lVar1 * 0x18 + 8);
        }
        (in_RDI->super_TPZVec<TPZGeoElSide>).fStore = (TPZGeoElSide *)&in_RDI->field_0x20;
        (in_RDI->super_TPZVec<TPZGeoElSide>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZGeoElSide>).fNAlloc = 10;
      }
      else {
        uVar4 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(0x18),0);
        uVar8 = uVar5 + 8;
        if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar5) {
          uVar8 = 0xffffffffffffffff;
        }
        puVar6 = (ulong *)operator_new__(uVar8);
        *puVar6 = uVar4;
        pTVar7 = (TPZGeoElSide *)(puVar6 + 1);
        if (uVar4 != 0) {
          local_88 = pTVar7;
          do {
            TPZGeoElSide::TPZGeoElSide(in_stack_ffffffffffffff40);
            local_88 = local_88 + 1;
          } while (local_88 != pTVar7 + uVar4);
        }
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<TPZGeoElSide>).fNElements;
            local_30 = local_30 + 1) {
          TPZGeoElSide::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          TPZGeoElSide::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
        if (((in_RDI->super_TPZVec<TPZGeoElSide>).fStore != (TPZGeoElSide *)&in_RDI->field_0x20) &&
           (pTVar3 = (in_RDI->super_TPZVec<TPZGeoElSide>).fStore, pTVar3 != (TPZGeoElSide *)0x0)) {
          lVar1 = *(long *)&pTVar3[-1].fSide;
          pTVar9 = pTVar3 + lVar1;
          while (pTVar3 != pTVar9) {
            pTVar9 = pTVar9 + -1;
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1104a0a);
          }
          operator_delete__(&pTVar3[-1].fSide,lVar1 * 0x18 + 8);
        }
        (in_RDI->super_TPZVec<TPZGeoElSide>).fStore = pTVar7;
        (in_RDI->super_TPZVec<TPZGeoElSide>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZGeoElSide>).fNAlloc = uVar4;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<TPZGeoElSide>).fNElements; local_20 < in_RSI;
          local_20 = local_20 + 1) {
        TPZGeoElSide::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      (in_RDI->super_TPZVec<TPZGeoElSide>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}